

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint local_33c;
  int local_338;
  uint local_334;
  pthread_t pStack_330;
  int sum;
  pthread_t tid_consumer;
  pthread_t tid_producer [64];
  int count [64];
  uint local_20;
  int i;
  int nthreads;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x4a);
    err_quit("usage: prodcons2 [nitems] [nthreads]");
  }
  iVar1 = atoi(argv[1]);
  if (iVar1 < 1000000) {
    local_338 = atoi(argv[1]);
  }
  else {
    local_338 = 1000000;
  }
  nitems = local_338;
  iVar1 = atoi(argv[2]);
  if (iVar1 < 0x40) {
    local_33c = atoi(argv[2]);
  }
  else {
    local_33c = 0x40;
  }
  printf("nitems = %d, nthreads = %d\n",(ulong)(uint)nitems,(ulong)local_33c);
  if ((nitems < 1) || (1000000 < nitems)) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x51);
    err_quit("nitems = %d",nitems);
  }
  if (((int)local_33c < 1) || (0x40 < (int)local_33c)) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x53);
    err_quit("nthreads = %d",local_33c);
  }
  for (local_20 = 0; (int)local_20 < (int)local_33c; local_20 = local_20 + 1) {
    count[(long)(int)local_20 + -2] = 0;
    iVar1 = pthread_create(tid_producer + (long)(int)local_20 + -1,(pthread_attr_t *)0x0,producer,
                           count + (long)(int)local_20 + -2);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
              ,0x58);
      err_quit("Failed to create thread %d",local_20);
    }
  }
  iVar1 = pthread_create(&stack0xfffffffffffffcd0,(pthread_attr_t *)0x0,consumer,(void *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x5c);
    err_quit("Failed to create consumer thread");
  }
  for (local_20 = 0; (int)local_20 < (int)local_33c; local_20 = local_20 + 1) {
    iVar1 = pthread_join(tid_producer[(long)(int)local_20 + -1],(void **)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
              ,0x60);
      err_quit("Failed to join thread %d(tid = %ld)",local_20,tid_producer[(long)(int)local_20 + -1]
              );
    }
  }
  local_334 = 0;
  for (local_20 = 0; (int)local_20 < (int)local_33c; local_20 = local_20 + 1) {
    printf("tid_producer[%d] = %ld, count[%d] = %d\n",(ulong)local_20,
           tid_producer[(long)(int)local_20 + -1],(ulong)local_20,
           (ulong)(uint)count[(long)(int)local_20 + -2]);
    local_334 = count[(long)(int)local_20 + -2] + local_334;
  }
  printf("sum = %d, nitems = %d\n",(ulong)local_334,(ulong)(uint)nitems);
  iVar1 = pthread_join(pStack_330,(void **)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x6c);
    err_quit("Failed to join consumer thread (tid = %ld)",pStack_330);
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv) {
    int nthreads, i, count[MAX_THREADS];
    pthread_t tid_producer[MAX_THREADS], tid_consumer;

    ASSERT_ERR_QUIT(3 == argc, "usage: prodcons2 [nitems] [nthreads]");

    nitems = min(atoi(argv[1]), MAX_ITEMS);
    nthreads = min(atoi(argv[2]), MAX_THREADS);

    printf("nitems = %d, nthreads = %d\n", nitems, nthreads);

    ASSERT_ERR_QUIT(nitems > 0 && nitems <= MAX_ITEMS, "nitems = %d", nitems);
    ASSERT_ERR_QUIT(nthreads > 0 && nthreads <= MAX_THREADS, 
        "nthreads = %d", nthreads);

    for (i = 0; i < nthreads; ++i) {
        count[i] = 0;
        ASSERT_ERR_QUIT(0 == pthread_create(&tid_producer[i], NULL,
            &producer, &count[i]), "Failed to create thread %d", i);
    }

    ASSERT_ERR_QUIT(0 == pthread_create(&tid_consumer, NULL, &consumer, NULL),
        "Failed to create consumer thread");

    for (i = 0; i < nthreads; ++i) {
        ASSERT_ERR_QUIT(0 == pthread_join(tid_producer[i], NULL), 
            "Failed to join thread %d(tid = %ld)", i, (long)(tid_producer[i]));
    }

    int sum = 0;
    for (i = 0; i < nthreads; ++i) {
        printf("tid_producer[%d] = %ld, count[%d] = %d\n", i, (long)(tid_producer[i]), i, count[i]);
        sum += count[i];
    }

    printf("sum = %d, nitems = %d\n", sum, nitems);

    ASSERT_ERR_QUIT(0 == pthread_join(tid_consumer, NULL), "Failed to join "
        "consumer thread (tid = %ld)", (long)tid_consumer);
    
    exit(0);
}